

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

int png_image_write_init(png_imagep image)

{
  int iVar1;
  undefined8 *__s;
  png_controlp control;
  png_infop info_ptr;
  png_structp png_ptr;
  png_imagep image_local;
  
  png_ptr = (png_structp)image;
  info_ptr = (png_infop)png_create_write_struct("1.6.44",image,png_safe_error,png_safe_warning);
  if ((png_structp)info_ptr != (png_structp)0x0) {
    control = (png_controlp)png_create_info_struct((png_const_structrp)info_ptr);
    if ((png_infop)control != (png_infop)0x0) {
      __s = (undefined8 *)png_malloc_warn((png_const_structrp)info_ptr,0x30);
      if (__s != (undefined8 *)0x0) {
        memset(__s,0,0x30);
        *__s = info_ptr;
        __s[1] = control;
        *(byte *)(__s + 5) = *(byte *)(__s + 5) & 0xfe | 1;
        png_ptr->jmp_buf_local[0].__jmpbuf[0] = (long)__s;
        return 1;
      }
      png_destroy_info_struct((png_const_structrp)info_ptr,(png_infopp)&control);
    }
    png_destroy_write_struct((png_structpp)&info_ptr,(png_infopp)0x0);
  }
  iVar1 = png_image_error((png_imagep)png_ptr,"png_image_write_: out of memory");
  return iVar1;
}

Assistant:

static int
png_image_write_init(png_imagep image)
{
   png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, image,
       png_safe_error, png_safe_warning);

   if (png_ptr != NULL)
   {
      png_infop info_ptr = png_create_info_struct(png_ptr);

      if (info_ptr != NULL)
      {
         png_controlp control = png_voidcast(png_controlp,
             png_malloc_warn(png_ptr, (sizeof *control)));

         if (control != NULL)
         {
            memset(control, 0, (sizeof *control));

            control->png_ptr = png_ptr;
            control->info_ptr = info_ptr;
            control->for_write = 1;

            image->opaque = control;
            return 1;
         }

         /* Error clean up */
         png_destroy_info_struct(png_ptr, &info_ptr);
      }

      png_destroy_write_struct(&png_ptr, NULL);
   }

   return png_image_error(image, "png_image_write_: out of memory");
}